

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall CodeGenGenericContext::InvalidateDependand(CodeGenGenericContext *this,x86Reg dreg)

{
  ArgType AVar1;
  x86Reg xVar2;
  long lVar3;
  MemCache *pMVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = 0;
  do {
    if ((*(int *)((long)&this->genReg[0].type + lVar3) == 2) &&
       (*(x86Reg *)((long)&this->genReg[0].field_1 + lVar3) == dreg)) {
      *(undefined4 *)((long)&this->genReg[0].type + lVar3) = 5;
    }
    if ((*(int *)((long)&this->genReg[0].type + lVar3) == 4) &&
       ((*(x86Reg *)((long)&this->genReg[0].ptrBase + lVar3) == dreg ||
        (*(x86Reg *)((long)&this->genReg[0].ptrIndex + lVar3) == dreg)))) {
      *(undefined4 *)((long)&this->genReg[0].type + lVar3) = 5;
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x220);
  lVar3 = 0;
  do {
    if ((*(int *)((long)&this->xmmReg[0].type + lVar3) == 4) &&
       ((*(x86Reg *)((long)&this->xmmReg[0].ptrBase + lVar3) == dreg ||
        (*(x86Reg *)((long)&this->genReg[0].ptrIndex + lVar3) == dreg)))) {
      *(undefined4 *)((long)&this->xmmReg[0].type + lVar3) = 5;
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x200);
  pMVar4 = this->memCache;
  uVar5 = this->memCacheFreeSlotCount;
  lVar3 = 0;
  do {
    AVar1 = (pMVar4->address).type;
    if (AVar1 == argPtr) {
      if (((pMVar4->address).ptrBase != dreg) && ((pMVar4->address).ptrIndex != dreg))
      goto LAB_001e2925;
      (pMVar4->address).type = argNone;
      (pMVar4->value).type = argNone;
      if (0xf < uVar5) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0xe9,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
      }
LAB_001e290e:
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      this->memCacheFreeSlotCount = uVar5;
      this->memCacheFreeSlots[uVar6] = (uint)lVar3;
    }
    else {
      if ((AVar1 == argReg) && ((pMVar4->address).field_1.reg == dreg)) {
        (pMVar4->address).type = argNone;
        (pMVar4->value).type = argNone;
        if (0xf < uVar5) {
          __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0xdf,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
        }
        goto LAB_001e290e;
      }
LAB_001e2925:
      AVar1 = (pMVar4->value).type;
      if (AVar1 == argPtr) {
        if ((pMVar4->value).ptrBase != dreg) {
          xVar2 = (pMVar4->value).ptrIndex;
          goto joined_r0x001e2948;
        }
LAB_001e294a:
        (pMVar4->value).type = argNone;
      }
      else if (AVar1 == argReg) {
        xVar2 = (pMVar4->value).field_1.reg;
joined_r0x001e2948:
        if (xVar2 == dreg) goto LAB_001e294a;
      }
    }
    lVar3 = lVar3 + 1;
    pMVar4 = pMVar4 + 1;
    if (lVar3 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateDependand(x86Reg dreg)
{
	for(unsigned i = 0; i < rRegCount; i++)
	{
		if(genReg[i].type == x86Argument::argReg && genReg[i].reg == dreg)
			genReg[i].type = x86Argument::argPtrLabel;

		if(genReg[i].type == x86Argument::argPtr && (genReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			genReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		if(xmmReg[i].type == x86Argument::argPtr && (xmmReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			xmmReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argReg && entry.address.reg == dreg)
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.address.type == x86Argument::argPtr && (entry.address.ptrBase == dreg || entry.address.ptrIndex == dreg))
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.value.type == x86Argument::argReg && entry.value.reg == dreg)
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}

		if(entry.value.type == x86Argument::argPtr && (entry.value.ptrBase == dreg || entry.value.ptrIndex == dreg))
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}
	}
}